

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O0

int Lodtalk::Behavior::stRegisterInClassTable(InterpreterProxy *interpreter)

{
  int iVar1;
  undefined4 extraout_var;
  Oop clazz;
  undefined4 extraout_var_01;
  Oop selfOop;
  InterpreterProxy *interpreter_local;
  undefined4 extraout_var_00;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    clazz.field_0._0_4_ = (*interpreter->_vptr_InterpreterProxy[0xb])();
    clazz.field_0.uintValue._4_4_ = extraout_var_00;
    iVar1 = (**interpreter->_vptr_InterpreterProxy)();
    VMContext::registerClassInTable((VMContext *)CONCAT44(extraout_var_01,iVar1),clazz);
    interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x12])();
  }
  else {
    interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x1e])();
  }
  return interpreter_local._4_4_;
}

Assistant:

int Behavior::stRegisterInClassTable(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 0)
        return interpreter->primitiveFailed();

    auto selfOop = interpreter->getReceiver();
    interpreter->getContext()->registerClassInTable(selfOop);
    return interpreter->returnReceiver();
}